

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__is_16_main(stbi__context *s)

{
  int iVar1;
  int iVar2;
  stbi__png p;
  stbi__png local_30;
  
  iVar2 = 0;
  local_30.s = s;
  iVar1 = stbi__parse_png_file(&local_30,2,0);
  if ((iVar1 == 0) || (local_30.depth != 0x10)) {
    (local_30.s)->img_buffer = (local_30.s)->img_buffer_original;
    (local_30.s)->img_buffer_end = (local_30.s)->img_buffer_original_end;
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int stbi__is_16_main(stbi__context *s)
{
   #ifndef STBI_NO_PNG
   if (stbi__png_is16(s))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_is16(s))  return 1;
   #endif

   return 0;
}